

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

void __thiscall
CppUnit::Exception::Exception(Exception *this,Message *message,SourceLine *sourceLine)

{
  SourceLine *sourceLine_local;
  Message *message_local;
  Exception *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__Exception_001a1890;
  Message::Message(&this->m_message,message);
  SourceLine::SourceLine(&this->m_sourceLine,sourceLine);
  std::__cxx11::string::string((string *)&this->m_whatMessage);
  return;
}

Assistant:

Exception::Exception( const Message &message, 
                      const SourceLine &sourceLine )
    : m_message( message )
    , m_sourceLine( sourceLine )
    , m_whatMessage()
{
}